

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_internal_entry.h
# Opt level: O3

__pid_t __thiscall ParallelManager::wait(ParallelManager *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->m_lock;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (((this->m_is_cancelled)._M_base._M_i & 1U) == 0) {
    do {
      if (this->m_done_count == this->m_task_count) break;
      std::condition_variable::wait((unique_lock *)&this->m_complete);
    } while (((this->m_is_cancelled)._M_base._M_i & 1U) == 0);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return extraout_EAX;
}

Assistant:

void wait()
	{
		std::unique_lock<std::mutex> lck(m_lock);
		m_complete.wait(lck, [this]{ return m_is_cancelled || m_done_count == m_task_count; });
	}